

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O1

SP __thiscall pbrt::remeshVertices(pbrt *this,SP *in)

{
  undefined8 uVar1;
  long lVar2;
  iterator __position;
  long lVar3;
  iterator __position_00;
  pointer pvVar4;
  iterator __position_01;
  float fVar5;
  iterator iVar6;
  mapped_type *pmVar7;
  element_type *peVar8;
  ostream *poVar9;
  int iVar10;
  pointer pvVar11;
  vec3f *pvVar12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var13;
  ulong uVar14;
  pointer pvVar15;
  long lVar16;
  SP SVar17;
  vector<int,_std::allocator<int>_> indexRemap;
  map<pbrt::FatVertex,_int,_std::less<pbrt::FatVertex>,_std::allocator<std::pair<const_pbrt::FatVertex,_int>_>_>
  vertexID;
  key_type local_98;
  vector<int,_std::allocator<int>_> local_80;
  pbrt *local_68;
  _Rb_tree<pbrt::FatVertex,_std::pair<const_pbrt::FatVertex,_int>,_std::_Select1st<std::pair<const_pbrt::FatVertex,_int>_>,_std::less<pbrt::FatVertex>,_std::allocator<std::pair<const_pbrt::FatVertex,_int>_>_>
  local_60;
  
  peVar8 = (in->super___shared_ptr<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  *(undefined8 *)this = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<pbrt::QuadMesh,std::allocator<pbrt::QuadMesh>,std::shared_ptr<pbrt::Material>&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 8),(QuadMesh **)this,
             (allocator<pbrt::QuadMesh> *)&local_60,&(peVar8->super_Shape).material);
  std::__shared_ptr<pbrt::QuadMesh,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<pbrt::QuadMesh,pbrt::QuadMesh>
            ((__shared_ptr<pbrt::QuadMesh,(__gnu_cxx::_Lock_policy)2> *)this,*(QuadMesh **)this);
  local_68 = this + 8;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::Texture>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::Texture>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::Texture>_>_>_>
  ::operator=((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::Texture>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::Texture>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::Texture>_>_>_>
               *)(*(long *)this + 0x30),
              &(((in->super___shared_ptr<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
               super_Shape).textures._M_t);
  peVar8 = (in->super___shared_ptr<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_80,
             ((long)(peVar8->vertex).
                    super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(peVar8->vertex).
                    super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555,
             (allocator_type *)&local_60);
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  peVar8 = (in->super___shared_ptr<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pvVar11 = (peVar8->vertex).
            super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((peVar8->vertex).super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>.
      _M_impl.super__Vector_impl_data._M_finish != pvVar11) {
    lVar16 = 0;
    uVar14 = 0;
    do {
      local_98.p.z = *(float *)((long)&pvVar11->z + lVar16);
      local_98.p._0_8_ = *(undefined8 *)((long)&pvVar11->x + lVar16);
      pvVar11 = (peVar8->normal).
                super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (pvVar11 ==
          (peVar8->normal).super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        local_98.n.x = 0.0;
        local_98.n.y = 0.0;
        local_98.n.z = 0.0;
      }
      else {
        uVar1 = *(undefined8 *)((long)&pvVar11->x + lVar16);
        local_98.n.x = (float)uVar1;
        local_98.n.y = (float)((ulong)uVar1 >> 0x20);
        local_98.n.z = *(float *)((long)&pvVar11->z + lVar16);
      }
      iVar6 = std::
              _Rb_tree<pbrt::FatVertex,_std::pair<const_pbrt::FatVertex,_int>,_std::_Select1st<std::pair<const_pbrt::FatVertex,_int>_>,_std::less<pbrt::FatVertex>,_std::allocator<std::pair<const_pbrt::FatVertex,_int>_>_>
              ::find(&local_60,&local_98);
      if ((_Rb_tree_header *)iVar6._M_node == &local_60._M_impl.super__Rb_tree_header) {
        lVar2 = *(long *)this;
        __position._M_current = *(vec3f **)(lVar2 + 0x78);
        lVar3 = *(long *)(lVar2 + 0x70);
        pvVar12 = (vec3f *)((long)&((((in->
                                      super___shared_ptr<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2>
                                      )._M_ptr)->vertex).
                                    super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->x + lVar16);
        if (__position._M_current == *(vec3f **)(lVar2 + 0x80)) {
          std::vector<pbrt::math::vec3f,std::allocator<pbrt::math::vec3f>>::
          _M_realloc_insert<pbrt::math::vec3f_const&>
                    ((vector<pbrt::math::vec3f,std::allocator<pbrt::math::vec3f>> *)(lVar2 + 0x70),
                     __position,pvVar12);
        }
        else {
          (__position._M_current)->z = pvVar12->z;
          fVar5 = pvVar12->y;
          (__position._M_current)->x = pvVar12->x;
          (__position._M_current)->y = fVar5;
          *(long *)(lVar2 + 0x78) = *(long *)(lVar2 + 0x78) + 0xc;
        }
        peVar8 = (in->super___shared_ptr<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        pvVar11 = (peVar8->normal).
                  super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (pvVar11 !=
            (peVar8->normal).
            super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          lVar2 = *(long *)this;
          pvVar12 = (vec3f *)((long)&pvVar11->x + lVar16);
          __position_00._M_current = *(vec3f **)(lVar2 + 0x90);
          if (__position_00._M_current == *(vec3f **)(lVar2 + 0x98)) {
            std::vector<pbrt::math::vec3f,std::allocator<pbrt::math::vec3f>>::
            _M_realloc_insert<pbrt::math::vec3f_const&>
                      ((vector<pbrt::math::vec3f,std::allocator<pbrt::math::vec3f>> *)(lVar2 + 0x88)
                       ,__position_00,pvVar12);
          }
          else {
            (__position_00._M_current)->z = pvVar12->z;
            fVar5 = pvVar12->y;
            (__position_00._M_current)->x = pvVar12->x;
            (__position_00._M_current)->y = fVar5;
            *(long *)(lVar2 + 0x90) = *(long *)(lVar2 + 0x90) + 0xc;
          }
        }
        pmVar7 = std::
                 map<pbrt::FatVertex,_int,_std::less<pbrt::FatVertex>,_std::allocator<std::pair<const_pbrt::FatVertex,_int>_>_>
                 ::operator[]((map<pbrt::FatVertex,_int,_std::less<pbrt::FatVertex>,_std::allocator<std::pair<const_pbrt::FatVertex,_int>_>_>
                               *)&local_60,&local_98);
        iVar10 = (int)((ulong)((long)__position._M_current - lVar3) >> 2) * -0x55555555;
        *pmVar7 = iVar10;
      }
      else {
        iVar10 = *(int *)&iVar6._M_node[1]._M_right;
      }
      local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar14] = iVar10;
      uVar14 = uVar14 + 1;
      peVar8 = (in->super___shared_ptr<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      pvVar11 = (peVar8->vertex).
                super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar16 = lVar16 + 0xc;
    } while (uVar14 < (ulong)(((long)(peVar8->vertex).
                                     super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar11 >> 2
                              ) * -0x5555555555555555));
  }
  pvVar4 = (peVar8->index).super__Vector_base<pbrt::math::vec4i,_std::allocator<pbrt::math::vec4i>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pvVar15 = (peVar8->index).
                 super__Vector_base<pbrt::math::vec4i,_std::allocator<pbrt::math::vec4i>_>._M_impl.
                 super__Vector_impl_data._M_start; pvVar15 != pvVar4; pvVar15 = pvVar15 + 1) {
    local_98.p.y = -NAN;
    local_98.p.x = -NAN;
    if (-1 < (long)pvVar15->x) {
      local_98.p.x = (float)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[pvVar15->x];
    }
    if (-1 < pvVar15->y) {
      local_98.p.y = (float)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[(uint)pvVar15->y];
    }
    local_98.n.x = -NAN;
    local_98.p.z = -NAN;
    if (-1 < pvVar15->z) {
      local_98.p.z = (float)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[(uint)pvVar15->z];
    }
    if (-1 < pvVar15->w) {
      local_98.n.x = (float)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[(uint)pvVar15->w];
    }
    lVar16 = *(long *)this;
    __position_01._M_current = *(vec4i **)(lVar16 + 0xa8);
    if (__position_01._M_current == *(vec4i **)(lVar16 + 0xb0)) {
      std::vector<pbrt::math::vec4i,_std::allocator<pbrt::math::vec4i>_>::
      _M_realloc_insert<pbrt::math::vec4i>
                ((vector<pbrt::math::vec4i,_std::allocator<pbrt::math::vec4i>_> *)(lVar16 + 0xa0),
                 __position_01,(vec4i *)&local_98);
    }
    else {
      (__position_01._M_current)->x = (int)local_98.p.x;
      (__position_01._M_current)->y = (int)local_98.p.y;
      (__position_01._M_current)->z = (int)local_98.p.z;
      (__position_01._M_current)->w = (int)local_98.n.x;
      *(long *)(lVar16 + 0xa8) = *(long *)(lVar16 + 0xa8) + 0x10;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"#pbrt:semantic: done remapping quad mesh. #verts: ",0x32);
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," -> ",4);
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  std::
  _Rb_tree<pbrt::FatVertex,_std::pair<const_pbrt::FatVertex,_int>,_std::_Select1st<std::pair<const_pbrt::FatVertex,_int>_>,_std::less<pbrt::FatVertex>,_std::allocator<std::pair<const_pbrt::FatVertex,_int>_>_>
  ::~_Rb_tree(&local_60);
  _Var13._M_pi = extraout_RDX;
  if (local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
    _Var13._M_pi = extraout_RDX_00;
  }
  SVar17.super___shared_ptr<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var13._M_pi;
  SVar17.super___shared_ptr<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (SP)SVar17.super___shared_ptr<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QuadMesh::SP remeshVertices(QuadMesh::SP in)
  {
    QuadMesh::SP out = std::make_shared<QuadMesh>(in->material);
    out->textures = in->textures;

    std::vector<int> indexRemap(in->vertex.size());
    std::map<FatVertex,int> vertexID;
    for (size_t i=0;i<in->vertex.size();i++) {
      FatVertex oldVertex;
      oldVertex.p = in->vertex[i];
      oldVertex.n = in->normal.empty()?vec3f(0.f):in->normal[i];

      auto it = vertexID.find(oldVertex);
      if (it == vertexID.end()) {
        int newID = (int)out->vertex.size();
        out->vertex.push_back(in->vertex[i]);
        if (!in->normal.empty())
          out->normal.push_back(in->normal[i]);
        // if (!in->texcoord.empty())
        //   out->texcoord.push_back(in->texcoord[i]);
        vertexID[oldVertex] = newID;
        indexRemap[i] = newID;
      } else {
        indexRemap[i] = it->second;
      }
    }
    for (auto idx : in->index) 
      out->index.push_back(vec4i(idx.x < 0 ? -1 : indexRemap[idx.x],
                                 idx.y < 0 ? -1 : indexRemap[idx.y],
                                 idx.z < 0 ? -1 : indexRemap[idx.z],
                                 idx.w < 0 ? -1 : indexRemap[idx.w]));
    std::cout << "#pbrt:semantic: done remapping quad mesh. #verts: " << in->vertex.size() << " -> " << out->vertex.size() << std::endl;
    return out;
  }